

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_voxels.cpp
# Opt level: O3

BYTE * __thiscall FVoxelTexture::GetPixels(FVoxelTexture *this)

{
  BYTE BVar1;
  int i_1;
  BYTE *pBVar2;
  int i;
  long lVar3;
  byte *pbVar4;
  
  if (this->Pixels == (BYTE *)0x0) {
    pBVar2 = (BYTE *)operator_new__(0x100);
    this->Pixels = pBVar2;
    pbVar4 = this->SourceVox->Palette;
    if (pbVar4 == (byte *)0x0) {
      lVar3 = 0;
      do {
        this->Pixels[lVar3] = (BYTE)lVar3;
        lVar3 = lVar3 + 1;
      } while (lVar3 != 0x100);
    }
    else {
      lVar3 = 0;
      do {
        BVar1 = FColorMatcher::Pick(&ColorMatcher,(uint)(byte)(*pbVar4 >> 4 | *pbVar4 * '\x04'),
                                    (uint)(byte)(pbVar4[1] >> 4 | pbVar4[1] * '\x04'),
                                    (uint)(byte)(pbVar4[2] >> 4 | pbVar4[2] * '\x04'));
        this->Pixels[lVar3] = BVar1;
        lVar3 = lVar3 + 1;
        pbVar4 = pbVar4 + 3;
      } while (lVar3 != 0x100);
    }
  }
  return this->Pixels;
}

Assistant:

const BYTE *FVoxelTexture::GetPixels ()
{
	// GetPixels gets called when a translated palette is used so we still need to implement it here.
	if (Pixels == NULL)
	{
		Pixels = new BYTE[256];

		BYTE *pp = SourceVox->Palette;

		if(pp != NULL)
		{
			for(int i=0;i<256;i++, pp+=3)
			{
				PalEntry pe;
				pe.r = (pp[0] << 2) | (pp[0] >> 4);
				pe.g = (pp[1] << 2) | (pp[1] >> 4);
				pe.b = (pp[2] << 2) | (pp[2] >> 4);
				Pixels[i] = ColorMatcher.Pick(pe);
			}
		}
		else 
		{
			for(int i=0;i<256;i++, pp+=3)
			{
				Pixels[i] = (BYTE)i;
			}
		}  
	}
	return Pixels;
}